

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_sub(lua_State *L)

{
  ulong in_RAX;
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t l;
  ulong local_28;
  
  local_28 = in_RAX;
  pcVar1 = luaL_checklstring(L,1,&local_28);
  uVar2 = luaL_checkinteger(L,2);
  uVar4 = uVar2;
  if (((long)uVar2 < 1) &&
     (uVar4 = 1, SBORROW8(uVar2,-local_28) == (long)(uVar2 + local_28) < 0 && uVar2 != 0)) {
    uVar4 = local_28 + 1 + uVar2;
  }
  uVar3 = luaL_optinteger(L,3,-1);
  uVar2 = local_28;
  if (((long)uVar3 <= (long)local_28) && (uVar2 = uVar3, (long)uVar3 < 0)) {
    if (SBORROW8(uVar3,-local_28) == (long)(uVar3 + local_28) < 0) {
      uVar2 = local_28 + 1 + uVar3;
    }
    else {
      uVar2 = 0;
    }
  }
  if (uVar2 < uVar4) {
    lua_pushstring(L,"");
  }
  else {
    lua_pushlstring(L,pcVar1 + (uVar4 - 1),(uVar2 - uVar4) + 1);
  }
  return 1;
}

Assistant:

static int str_sub (lua_State *L) {
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  size_t start = posrelatI(luaL_checkinteger(L, 2), l);
  size_t end = getendpos(L, 3, -1, l);
  if (start <= end)
    lua_pushlstring(L, s + start - 1, (end - start) + 1);
  else lua_pushliteral(L, "");
  return 1;
}